

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O1

void __thiscall
SeedTree::SeedTree(SeedTree *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *seed,
                  size_t num_leaves,limbo_salt_t *salt,size_t rep_idx)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  _Bit_type *p_Var1;
  ulong *puVar2;
  pointer poVar3;
  int iVar4;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  pointer puVar8;
  byte bVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  size_type __new_size;
  long lVar15;
  size_t sVar16;
  ulong uVar17;
  _Storage<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false> local_a8;
  char local_90;
  _Storage<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false> local_88;
  char local_70;
  undefined7 uStack_6f;
  long local_68;
  long local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  limbo_salt_t *local_40;
  size_t local_38;
  
  this_00 = &this->_node_exists;
  *(undefined8 *)
   &(this->_node_exists).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->_node_exists).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  *(undefined8 *)
   &(this->_node_exists).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_offset = 0;
  (this->_node_exists).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->_data).
  super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_node_exists).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->_data).
  super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_data).
  super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->_num_leaves = num_leaves;
  uVar10 = (int)num_leaves - 1;
  if (uVar10 == 0) {
    bVar9 = 0;
  }
  else {
    iVar4 = 0x1f;
    if (uVar10 != 0) {
      for (; uVar10 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    bVar9 = (byte)iVar4 ^ 0x1f;
  }
  bVar9 = 0x20 - bVar9;
  if ((int)num_leaves == 0) {
    bVar9 = 0;
  }
  __new_size = ((long)(2 << (bVar9 & 0x1f)) + (num_leaves - (long)(1 << (bVar9 & 0x1f)))) - 1;
  this->_num_total_nodes = __new_size;
  local_40 = salt;
  local_38 = rep_idx;
  std::vector<bool,_std::allocator<bool>_>::resize(this_00,__new_size,false);
  uVar6 = this->_num_total_nodes;
  uVar11 = uVar6 - num_leaves;
  if (uVar11 < uVar6) {
    p_Var1 = (this_00->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p;
    do {
      uVar6 = uVar11 + 0x3f;
      if (-1 < (long)uVar11) {
        uVar6 = uVar11;
      }
      puVar2 = p_Var1 + ((long)uVar6 >> 6) +
                        (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) +
                        0xffffffffffffffff;
      *puVar2 = *puVar2 | 1L << ((byte)uVar11 & 0x3f);
      uVar11 = uVar11 + 1;
      uVar6 = this->_num_total_nodes;
    } while (uVar11 < uVar6);
  }
  uVar11 = uVar6 - num_leaves;
  if (uVar11 != 0) {
    p_Var1 = (this_00->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p;
    uVar6 = uVar6 * 2 + num_leaves * -2 + 1;
    do {
      if (uVar6 < this->_num_total_nodes) {
        uVar14 = uVar6 + 0x3f;
        if (-1 < (long)uVar6) {
          uVar14 = uVar6;
        }
        if ((p_Var1[((long)uVar14 >> 6) +
                    (ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff]
             >> (uVar6 & 0x3f) & 1) == 0) goto LAB_00112e48;
LAB_00112e83:
        uVar14 = uVar11 + 0x3f;
        if (-1 < (long)uVar11) {
          uVar14 = uVar11;
        }
        p_Var1[((long)uVar14 >> 6) +
               (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] =
             p_Var1[((long)uVar14 >> 6) +
                    (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff
                   ] | 1L << ((byte)uVar11 & 0x3f);
      }
      else {
LAB_00112e48:
        uVar14 = uVar6 + 1;
        if (uVar14 < this->_num_total_nodes) {
          uVar17 = uVar6 + 0x40;
          if (-1 < (long)uVar14) {
            uVar17 = uVar14;
          }
          if ((p_Var1[((long)uVar17 >> 6) +
                      (ulong)((uVar14 & 0x800000000000003e) < 0x8000000000000001) +
                      0xffffffffffffffff] >> ((uint)uVar14 & 0x3e) & 1) != 0) goto LAB_00112e83;
        }
      }
      uVar6 = uVar6 - 2;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
  }
  puVar2 = (this->_node_exists).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  *puVar2 = *puVar2 | 1;
  std::
  vector<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::resize(&this->_data,this->_num_total_nodes);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_88._M_value,seed);
  local_70 = '\x01';
  std::_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
  _M_move_assign((_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)(this->_data).
                    super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                 (_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)&local_88._M_value);
  if ((local_70 == '\x01') &&
     (local_70 = '\0',
     local_88._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_88._M_value.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88._M_value.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage - local_88._0_8_);
  }
  uVar11 = (this->_num_total_nodes >> 1) - 1;
  lVar15 = 0x20;
  uVar17 = 1;
  lVar13 = 0;
  uVar6 = 0x800000000000003f;
  local_48 = 0x800000000000003e;
  uVar14 = 0;
  local_58 = 0x800000000000003f;
  local_50 = uVar11;
  do {
    if (uVar14 < this->_num_total_nodes) {
      uVar7 = uVar14 + 0x3f;
      if (-1 < (long)uVar14) {
        uVar7 = uVar14;
      }
      if (((this_00->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar7 >> 6) + (ulong)((uVar14 & uVar6) < 0x8000000000000001) + 0xffffffffffffffff
           ] >> (uVar14 & 0x3f) & 1) != 0) {
        poVar3 = (this->_data).
                 super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (*(char *)((long)&(poVar3->
                             super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                             )._M_payload + lVar13 + 0x18) == '\0') {
          std::__throw_bad_optional_access();
        }
        expandSeed((pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&local_88._M_value,(SeedTree *)0x8000000000000000,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   ((long)&(poVar3->
                           super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                           )._M_payload + lVar13),local_40,local_38,uVar14);
        if (uVar17 < this->_num_total_nodes) {
          uVar7 = uVar17 + 0x3f;
          if (-1 < (long)uVar17) {
            uVar7 = uVar17;
          }
          if (((this_00->super__Bvector_base<std::allocator<bool>_>)._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [((long)uVar7 >> 6) +
                (ulong)((uVar17 & uVar6) < 0x8000000000000001) + 0xffffffffffffffff] >>
               (uVar17 & 0x3f) & 1) != 0) {
            local_a8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_a8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_a8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            uVar6 = (long)local_88._M_value.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - local_88._0_8_;
            if (uVar6 == 0) {
              puVar8 = (pointer)0x0;
            }
            else {
              if ((long)uVar6 < 0) {
                std::__throw_bad_alloc();
              }
              puVar8 = (pointer)operator_new(uVar6);
            }
            local_a8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = puVar8 + uVar6;
            sVar16 = (long)local_88._M_value.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish - local_88._0_8_;
            local_a8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = puVar8;
            if (sVar16 != 0) {
              local_a8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish = puVar8;
              memmove(puVar8,local_88._M_value.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,sVar16);
            }
            local_a8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = puVar8 + sVar16;
            local_90 = '\x01';
            std::_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::_M_move_assign((_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)((long)&(((this->_data).
                                          super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                                        )._M_payload + lVar15),
                             (_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&local_a8._M_value);
            uVar6 = local_58;
            uVar11 = local_50;
            if ((local_90 == '\x01') &&
               (local_90 = '\0',
               local_a8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
              operator_delete(local_a8._M_value.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_a8._M_value.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              local_a8._0_8_);
              uVar6 = local_58;
              uVar11 = local_50;
            }
          }
        }
        uVar7 = uVar17 + 1;
        if (uVar7 < this->_num_total_nodes) {
          uVar12 = uVar17 + 0x40;
          if (-1 < (long)uVar7) {
            uVar12 = uVar7;
          }
          if (((this_00->super__Bvector_base<std::allocator<bool>_>)._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [((long)uVar12 >> 6) +
                (ulong)((uVar7 & local_48) < 0x8000000000000001) + 0xffffffffffffffff] >>
               ((uint)uVar7 & 0x3e) & 1) != 0) {
            local_a8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_a8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_a8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            uVar6 = local_68 - CONCAT71(uStack_6f,local_70);
            if (uVar6 == 0) {
              puVar8 = (pointer)0x0;
            }
            else {
              if ((long)uVar6 < 0) {
                std::__throw_bad_alloc();
              }
              puVar8 = (pointer)operator_new(uVar6);
            }
            local_a8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = puVar8 + uVar6;
            sVar16 = local_68 - (long)CONCAT71(uStack_6f,local_70);
            local_a8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = puVar8;
            if (sVar16 != 0) {
              local_a8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish = puVar8;
              memmove(puVar8,(void *)CONCAT71(uStack_6f,local_70),sVar16);
            }
            local_a8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = puVar8 + sVar16;
            local_90 = '\x01';
            std::_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::_M_move_assign((_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)((long)&(this->_data).
                                        super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[1].
                                        super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                                        ._M_payload + lVar15),
                             (_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&local_a8._M_value);
            uVar6 = local_58;
            uVar11 = local_50;
            if ((local_90 == '\x01') &&
               (local_90 = '\0',
               local_a8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
              operator_delete(local_a8._M_value.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_a8._M_value.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              local_a8._0_8_);
              uVar6 = local_58;
              uVar11 = local_50;
            }
          }
        }
        pvVar5 = (void *)CONCAT71(uStack_6f,local_70);
        if (pvVar5 != (void *)0x0) {
          operator_delete(pvVar5,local_60 - (long)pvVar5);
        }
        if (local_88._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88._M_value.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_88._M_value.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage - local_88._0_8_);
        }
      }
    }
    uVar14 = uVar14 + 1;
    lVar15 = lVar15 + 0x40;
    uVar17 = uVar17 + 2;
    lVar13 = lVar13 + 0x20;
  } while (uVar14 <= uVar11);
  return;
}

Assistant:

SeedTree::SeedTree(std::vector<uint8_t> seed, const size_t num_leaves,
                   const limbo_salt_t &salt, const size_t rep_idx)
    : _data(), _node_exists(), _num_leaves(num_leaves) {
  size_t tree_depth = 1 + ceil_log2(num_leaves);

  _num_total_nodes =
      ((1 << (tree_depth)) - 1) -
      ((1 << (tree_depth - 1)) -
       num_leaves); /* Num nodes in complete - number of missing leaves */

  _node_exists.resize(_num_total_nodes);
  for (size_t i = _num_total_nodes - num_leaves; i < _num_total_nodes; i++) {
    _node_exists[i] = true;
  }

  for (size_t i = _num_total_nodes - num_leaves; i > 0; i--) {
    if (node_exists(2 * i + 1) || node_exists(2 * i + 2)) {
      _node_exists[i] = true;
    }
  }
  _node_exists[0] = true;
  // push back root seed
  _data.resize(_num_total_nodes);
  _data[0] = std::optional(seed);

  size_t last_non_leaf = get_parent(_num_total_nodes - 1);
  for (size_t i = 0; i <= last_non_leaf; i++) {
    if (!node_exists(i))
      continue;
    auto [left, right] = expandSeed(_data[i].value(), salt, rep_idx, i);
    if (node_exists(2 * i + 1)) {
      _data[2 * i + 1] = std::optional(left);
    }
    if (node_exists(2 * i + 2)) {
      _data[2 * i + 2] = std::optional(right);
    }
  }
}